

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdStarter.c
# Opt level: O2

void Cmd_RunStarter(char *pFileName,char *pBinary,char *pCommand,int nCores)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  FILE *pFVar4;
  size_t sVar5;
  byte *__s;
  void *__ptr;
  char *pcVar6;
  ulong uVar7;
  FILE *__stream;
  ulong uVar8;
  char *pcVar9;
  abctime aVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  
  aVar3 = Abc_Clock();
  if (nCores < 2) {
    fprintf(_stdout,"The number of cores (%d) should be more than 1.\n",(ulong)(uint)nCores);
    return;
  }
  pFVar4 = fopen(pFileName,"rb");
  if (pFVar4 == (FILE *)0x0) {
    fprintf(_stdout,"Input file \"%s\" cannot be opened.\n",pFileName);
    return;
  }
  iVar13 = 0;
  iVar2 = 0;
  do {
    iVar12 = 0;
    do {
      iVar1 = fgetc(pFVar4);
      if (iVar1 == -1) {
        iVar1 = 0;
        iVar12 = 0;
        if (pBinary != (char *)0x0) {
          sVar5 = strlen(pBinary);
          iVar12 = (int)sVar5;
        }
        if (pCommand != (char *)0x0) {
          sVar5 = strlen(pCommand);
          iVar1 = (int)sVar5;
        }
        iVar1 = iVar2 * 2 + 100 + iVar12 + iVar1;
        __s = (byte *)malloc((long)iVar1);
        __ptr = malloc((ulong)(iVar13 + 10) * 8);
        if (pCommand == (char *)0x0) goto LAB_006cc847;
        rewind(pFVar4);
        goto LAB_006cc7cd;
      }
      iVar12 = iVar12 + 1;
    } while (iVar1 != 10);
    iVar13 = iVar13 + 1;
    if (iVar2 <= iVar12) {
      iVar2 = iVar12;
    }
  } while( true );
LAB_006cc7cd:
  pcVar6 = fgets((char *)__s,iVar1,pFVar4);
  if (pcVar6 == (char *)0x0) {
LAB_006cc847:
    rewind(pFVar4);
    uVar7 = 0;
    do {
      pcVar6 = fgets((char *)__s,iVar1,pFVar4);
      if (pcVar6 == (char *)0x0) {
        free(__ptr);
        free(__s);
        fclose(pFVar4);
        while( true ) {
          iVar13 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
          iVar2 = nThreadsRunning;
          if (iVar13 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xed,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
          iVar13 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          if (iVar13 != 0) break;
          if (iVar2 == 0) {
            pFVar4 = _stdout;
            fprintf(_stdout,"Finished processing commands in file \"%s\".  ",pFileName);
            iVar2 = (int)pFVar4;
            aVar10 = Abc_Clock();
            Abc_Print(iVar2,"%s =","Total wall time");
            Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar10 - aVar3) / 1000000.0);
            fflush(_stdout);
            return;
          }
        }
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                      ,0xef,"void Cmd_RunStarter(char *, char *, char *, int)");
      }
      sVar5 = strlen((char *)__s);
      uVar8 = sVar5 & 0xffffffff;
      while( true ) {
        uVar8 = uVar8 - 1;
        if ((int)(uint)uVar8 < 0) break;
        uVar11 = (uint)uVar8 & 0x7fffffff;
        if ((0x20 < (ulong)__s[uVar11]) || ((0x100002600U >> ((ulong)__s[uVar11] & 0x3f) & 1) == 0))
        break;
        __s[uVar11] = 0;
      }
      if ((0x23 < (ulong)*__s) || ((0x900002601U >> ((ulong)*__s & 0x3f) & 1) == 0)) {
        if (pCommand == (char *)0x0) {
          sVar5 = strlen((char *)__s);
          pcVar6 = (char *)malloc(sVar5 + 1);
          strcpy(pcVar6,(char *)__s);
        }
        else {
          pcVar6 = (char *)malloc((long)iVar1);
          pcVar9 = Extra_FileNameGenericAppend((char *)__s,".txt");
          sprintf(pcVar6,"%s -c \"%s; %s\" > %s",pBinary,__s,pCommand,pcVar9);
        }
        fprintf(_stdout,"Calling:  %s\n",pcVar6);
        fflush(_stdout);
        do {
          iVar12 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
          iVar2 = nThreadsRunning;
          if (iVar12 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xd5,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
          iVar12 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
          if (iVar12 != 0) {
            __assert_fail("status == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                          ,0xd7,"void Cmd_RunStarter(char *, char *, char *, int)");
          }
        } while (nCores + -1 <= iVar2);
        iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
        if (iVar2 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                        ,0xde,"void Cmd_RunStarter(char *, char *, char *, int)");
        }
        nThreadsRunning = nThreadsRunning + 1;
        iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        if (iVar2 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                        ,0xe0,"void Cmd_RunStarter(char *, char *, char *, int)");
        }
        iVar2 = pthread_create((pthread_t *)((long)__ptr + uVar7 * 8),(pthread_attr_t *)0x0,
                               Abc_RunThread,pcVar6);
        if (iVar2 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                        ,0xe3,"void Cmd_RunStarter(char *, char *, char *, int)");
        }
        if (iVar13 + 10 <= uVar7) {
          __assert_fail("i < nLines",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                        ,0xe4,"void Cmd_RunStarter(char *, char *, char *, int)");
        }
      }
      uVar7 = uVar7 + 1;
    } while( true );
  }
  sVar5 = strlen((char *)__s);
  uVar7 = sVar5 & 0xffffffff;
  while( true ) {
    uVar7 = uVar7 - 1;
    if ((int)(uint)uVar7 < 0) break;
    uVar11 = (uint)uVar7 & 0x7fffffff;
    if ((0x20 < (ulong)__s[uVar11]) || ((0x100002600U >> ((ulong)__s[uVar11] & 0x3f) & 1) == 0))
    break;
    __s[uVar11] = 0;
  }
  if ((0x23 < (ulong)*__s) || ((0x900002601U >> ((ulong)*__s & 0x3f) & 1) == 0)) {
    __stream = fopen((char *)__s,"rb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Starter cannot open file \"%s\".\n",__s);
      fflush(_stdout);
      free(__ptr);
      free(__s);
      fclose(pFVar4);
      return;
    }
    fclose(__stream);
  }
  goto LAB_006cc7cd;
}

Assistant:

void Cmd_RunStarter( char * pFileName, char * pBinary, char * pCommand, int nCores )
{
    FILE * pFile, * pFileTemp;
    pthread_t * pThreadIds;
    char * BufferCopy, * Buffer;
    int nLines, LineMax, Line, Len;
    int i, c, status, Counter;
    abctime clk = Abc_Clock();

    // check the number of cores
    if ( nCores < 2 )
    {
        fprintf( stdout, "The number of cores (%d) should be more than 1.\n", nCores ); 
        return; 
    }

    // open the file and make sure it is available
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    { 
        fprintf( stdout, "Input file \"%s\" cannot be opened.\n", pFileName ); 
        return; 
    }

    // count the number of lines and the longest line
    nLines = LineMax = Line = 0;
    while ( (c = fgetc(pFile)) != EOF )
    {
        Line++;
        if ( c != '\n' )
            continue;
        nLines++;
        LineMax = Abc_MaxInt( LineMax, Line );
        Line = 0;       
    }
    nLines += 10;
    LineMax += LineMax + 100;
    LineMax += pBinary  ? strlen(pBinary) : 0;
    LineMax += pCommand ? strlen(pCommand) : 0;

    // allocate storage
    Buffer = ABC_ALLOC( char, LineMax );
    pThreadIds = ABC_ALLOC( pthread_t, nLines );

    // check if all files can be opened
    if ( pCommand != NULL )
    {
        // read file names
        rewind( pFile );
        for ( i = 0; fgets( Buffer, LineMax, pFile ) != NULL; i++ )
        {
            // remove trailing spaces
            for ( Len = strlen(Buffer) - 1; Len >= 0; Len-- )
                if ( Buffer[Len] == '\n' || Buffer[Len] == '\r' || Buffer[Len] == '\t' || Buffer[Len] == ' ' )
                    Buffer[Len] = 0;
                else
                    break;

            // get command from file
            if ( Buffer[0] == 0 || Buffer[0] == '\n' || Buffer[0] == '\r' || Buffer[0] == '\t' || Buffer[0] == ' ' || Buffer[0] == '#' )
                continue;

            // try to open the file
            pFileTemp = fopen( Buffer, "rb" );
            if ( pFileTemp == NULL )
            {
                fprintf( stdout, "Starter cannot open file \"%s\".\n", Buffer );
                fflush( stdout );
                ABC_FREE( pThreadIds );
                ABC_FREE( Buffer );
                fclose( pFile );
                return;
            }
            fclose( pFileTemp );
        }
    } 
 
    // read commands and execute at most <num> of them at a time
    rewind( pFile );
    for ( i = 0; fgets( Buffer, LineMax, pFile ) != NULL; i++ )
    {
        // remove trailing spaces
        for ( Len = strlen(Buffer) - 1; Len >= 0; Len-- )
            if ( Buffer[Len] == '\n' || Buffer[Len] == '\r' || Buffer[Len] == '\t' || Buffer[Len] == ' ' )
                Buffer[Len] = 0;
            else
                break;

        // get command from file
        if ( Buffer[0] == 0 || Buffer[0] == '\n' || Buffer[0] == '\r' || Buffer[0] == '\t' || Buffer[0] == ' ' || Buffer[0] == '#' )
            continue;

        // create command
        if ( pCommand != NULL )
        {
            BufferCopy = ABC_ALLOC( char, LineMax );
            sprintf( BufferCopy, "%s -c \"%s; %s\" > %s", pBinary, Buffer, pCommand, Extra_FileNameGenericAppend(Buffer, ".txt") );
        }
        else
            BufferCopy = Abc_UtilStrsav( Buffer );
        fprintf( stdout, "Calling:  %s\n", (char *)BufferCopy );  
        fflush( stdout );

        // wait till there is an empty thread
        while ( 1 )
        {
            status = pthread_mutex_lock(&mutex);   assert(status == 0);
            Counter = nThreadsRunning;
            status = pthread_mutex_unlock(&mutex); assert(status == 0);
            if ( Counter < nCores - 1 )
                break;
//            Sleep( 100 );
        }

        // increament the number of threads running
        status = pthread_mutex_lock(&mutex);   assert(status == 0);
        nThreadsRunning++;
        status = pthread_mutex_unlock(&mutex); assert(status == 0);

        // create thread to execute this command
        status = pthread_create( &pThreadIds[i], NULL, Abc_RunThread, (void *)BufferCopy );  assert(status == 0);
        assert( i < nLines );
    }
    ABC_FREE( pThreadIds );
    ABC_FREE( Buffer );
    fclose( pFile );

    // wait for all the threads to finish
    while ( 1 )
    {
        status = pthread_mutex_lock(&mutex);   assert(status == 0);
        Counter = nThreadsRunning;
        status = pthread_mutex_unlock(&mutex); assert(status == 0);
        if ( Counter == 0 )
            break;
    }

    // cleanup
//    status = pthread_mutex_destroy(&mutex);   assert(status == 0);
//    mutex = PTHREAD_MUTEX_INITIALIZER;
    fprintf( stdout, "Finished processing commands in file \"%s\".  ", pFileName );
    Abc_PrintTime( 1, "Total wall time", Abc_Clock() - clk );
    fflush( stdout );
}